

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O3

void UnitTest::CheckEqual<unsigned_int,unsigned_long>
               (TestResults *results,uint *expected,unsigned_long *actual,TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  MemoryOutStream stream;
  undefined1 local_1c0 [408];
  
  if (*actual != (ulong)*expected) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Expected ",9);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," but was ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x90));
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}